

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_tapbranch_simple2_Test::TestBody
          (Descriptor_Parse_Taproot_tapbranch_simple2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference this_00;
  char *rhs;
  char *in_R9;
  AssertHelper local_1150;
  Message local_1148;
  ByteData256 local_1140;
  string local_1128;
  undefined1 local_1108 [8];
  AssertionResult gtest_ar_8;
  Message local_10f0;
  string local_10e8;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar_7;
  Message local_10b0;
  string local_10a8;
  undefined1 local_1088 [8];
  AssertionResult gtest_ar_6;
  Message local_1070;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar_5;
  Message local_1050;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1048;
  SchnorrPubkey local_1030;
  AssertHelper local_1018;
  Message local_1010;
  Address local_1008;
  string local_e90;
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_4;
  Message local_e58;
  HashType local_e50 [2];
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_3;
  Message local_e30;
  AddressType local_e28 [2];
  undefined1 local_e20 [8];
  AssertionResult gtest_ar_2;
  Message local_e08;
  TapBranch local_e00;
  AssertHelper local_d88;
  Message local_d80;
  string local_d78;
  AssertHelper local_d58;
  Message local_d50;
  Script local_d48;
  string local_d10;
  AssertHelper local_cf0;
  Message local_ce8;
  bool local_cd9;
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_ca8;
  Message local_ca0;
  bool local_c91;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_c60;
  Message local_c58;
  bool local_c49;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_c18;
  Message local_c10;
  bool local_c01;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_bd0;
  Message local_bc8;
  bool local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar__2;
  Message local_ba0;
  uint32_t local_b98 [2];
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b60;
  Message local_b58;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b18;
  Message local_b10;
  bool local_b01;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_;
  Message local_ae8;
  DescriptorScriptReference local_ae0;
  undefined4 local_78c;
  AssertionResult gtest_ar;
  CfdException *except;
  NetType local_5f4;
  undefined1 local_5f0 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  TapBranch tree;
  DescriptorScriptReference script_ref;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor1;
  Descriptor_Parse_Taproot_tapbranch_simple2_Test *this_local;
  
  descriptor1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "tr(c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,{663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294,0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1})"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TapBranch::TapBranch
            ((TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_5f0);
  local_5f4 = kRegtest;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_ae0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ae0);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_ae0);
    }
  }
  else {
    testing::Message::Message(&local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x51d,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_ae8);
  }
  local_b01 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b00,&local_b01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b00,
               (AssertionResult *)"script_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x51e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
    testing::internal::AssertHelper::~AssertHelper(&local_b18);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  local_b49 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar1) {
    testing::Message::Message(&local_b58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b48,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x51f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b60,&local_b58);
    testing::internal::AssertHelper::~AssertHelper(&local_b60);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  local_b98[1] = 1;
  local_b98[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_b90,"1","script_ref.GetKeyNum()",(int *)(local_b98 + 1),
             local_b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x520,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_bb9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb8,&local_bb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_bb8,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x521,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bd0,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_bd0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c01 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c00,&local_c01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_c00,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x522,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c18,&local_c10);
    testing::internal::AssertHelper::~AssertHelper(&local_c18);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c49 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c48,&local_c49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_c48,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x523,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c60,&local_c58);
    testing::internal::AssertHelper::~AssertHelper(&local_c60);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_c91 = cfd::core::DescriptorScriptReference::HasTapBranch
                        ((DescriptorScriptReference *)
                         &tree.branch_list_.
                          super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c90,&local_c91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_c90,
               (AssertionResult *)"script_ref.HasTapBranch()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x524,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper(&local_ca8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &tree.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_cd9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cd8,&local_cd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar1) {
    testing::Message::Message(&local_ce8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d10,(internal *)local_cd8,(AssertionResult *)"script_ref.HasScriptTree()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x525,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cf0,&local_ce8);
    testing::internal::AssertHelper::~AssertHelper(&local_cf0);
    std::__cxx11::string::~string((string *)&local_d10);
    testing::Message::~Message(&local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_d48,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_d48);
      cfd::core::Script::~Script(&local_d48);
    }
  }
  else {
    testing::Message::Message(&local_d50);
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x526,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    testing::Message::~Message(&local_d50);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_d78,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_d78);
      std::__cxx11::string::~string((string *)&local_d78);
    }
  }
  else {
    testing::Message::Message(&local_d80);
    testing::internal::AssertHelper::AssertHelper
              (&local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x527,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d88,&local_d80);
    testing::internal::AssertHelper::~AssertHelper(&local_d88);
    testing::Message::~Message(&local_d80);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetTapBranch
                (&local_e00,
                 (DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::TapBranch::operator=
                ((TapBranch *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_e00);
      cfd::core::TapBranch::~TapBranch(&local_e00);
    }
  }
  else {
    testing::Message::Message(&local_e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x528,
               "Expected: tree = script_ref.GetTapBranch() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e08);
  }
  local_e28[1] = 7;
  local_e28[0] = cfd::core::DescriptorScriptReference::GetAddressType
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_e20,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_e28 + 1,local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e20);
  if (!bVar1) {
    testing::Message::Message(&local_e30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x529,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e20);
  local_e50[1] = 6;
  local_e50[0] = cfd::core::DescriptorScriptReference::GetHashType
                           ((DescriptorScriptReference *)
                            &tree.branch_list_.
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_e48,"HashType::kTaproot","script_ref.GetHashType()",
             local_e50 + 1,local_e50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x52a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_1008,
             (DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_5f4);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_e90,&local_1008);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e70,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bcrt1p6r63tl53d930my75e76ncsgw05gyk838e08079kxuuguwxr0yyjssdax9t\"",pcVar2,
             "bcrt1p6r63tl53d930my75e76ncsgw05gyk838e08079kxuuguwxr0yyjssdax9t");
  std::__cxx11::string::~string((string *)&local_e90);
  cfd::core::Address::~Address(&local_1008);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_1010);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x52c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    testing::Message::~Message(&local_1010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_1048,
                 (DescriptorScriptReference *)
                 &tree.branch_list_.
                  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_1048,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_1030,this_00);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_5f0,&local_1030);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_1030);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_1048);
    }
  }
  else {
    testing::Message::Message(&local_1050);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x52d,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1050);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1050);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1068,"desc_str.c_str()","descriptor1.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar1) {
    testing::Message::Message(&local_1070);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1068);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x52e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1070);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1070);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  cfd::core::Script::ToString_abi_cxx11_(&local_10a8,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1088,"locking_script.ToString().c_str()",
             "\"1 d0f515fe916962fd93d4cfb53c410e7d104b1e27cbceff16c6e711c7186f2125\"",pcVar2,
             "1 d0f515fe916962fd93d4cfb53c410e7d104b1e27cbceff16c6e711c7186f2125");
  std::__cxx11::string::~string((string *)&local_10a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1088);
  if (!bVar1) {
    testing::Message::Message(&local_10b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1088);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x530,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_10b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_10b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1088);
  cfd::core::TapBranch::ToString_abi_cxx11_
            (&local_10e8,
             (TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10c8,"tree.ToString().c_str()",
             "\"{0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1,663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294}\""
             ,pcVar2,
             "{0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1,663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294}"
            );
  std::__cxx11::string::~string((string *)&local_10e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar1) {
    testing::Message::Message(&local_10f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x532,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_10f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_10f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  cfd::core::TapBranch::GetCurrentBranchHash
            (&local_1140,
             (TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1128,&local_1140);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1108,"tree.GetCurrentBranchHash().GetHex().c_str()",
             "\"6c2c113096e1876557951f05211acde706640f832862fb40549d60d9421c7f14\"",pcVar2,
             "6c2c113096e1876557951f05211acde706640f832862fb40549d60d9421c7f14");
  std::__cxx11::string::~string((string *)&local_1128);
  cfd::core::ByteData256::~ByteData256(&local_1140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1108);
  if (!bVar1) {
    testing::Message::Message(&local_1148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1108);
    testing::internal::AssertHelper::AssertHelper
              (&local_1150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x534,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1150,&local_1148);
    testing::internal::AssertHelper::~AssertHelper(&local_1150);
    testing::Message::~Message(&local_1148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1108);
  local_78c = 0;
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_5f0);
  cfd::core::TapBranch::~TapBranch
            ((TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.branch_list_.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_tapbranch_simple2) {
  std::string descriptor1 = "tr(c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,{663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294,0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1})";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TapBranch tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
    return;
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_TRUE(script_ref.HasTapBranch());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetTapBranch());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1p6r63tl53d930my75e76ncsgw05gyk838e08079kxuuguwxr0yyjssdax9t");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 d0f515fe916962fd93d4cfb53c410e7d104b1e27cbceff16c6e711c7186f2125");
  EXPECT_STREQ(tree.ToString().c_str(),
      "{0e167d3d619d2b16fb08736a6e696eb6814c6d99a578c8c268d4195aeb9f72d1,663e2b115c7bc9af54395266c7c0b0dc6f879c55ecaa0becb2e041ab1cfee294}");
  EXPECT_STREQ(tree.GetCurrentBranchHash().GetHex().c_str(),
      "6c2c113096e1876557951f05211acde706640f832862fb40549d60d9421c7f14");
}